

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersections.c
# Opt level: O2

_Bool intersects_box(Vec3 vmin,Vec3 vmax,Ray r)

{
  Ray RVar1;
  float fVar2;
  float fVar4;
  undefined1 auVar3 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 local_18;
  float local_10;
  undefined8 local_c;
  float local_4;
  
  RVar1 = r;
  local_18 = vmin._0_8_;
  local_10 = vmin.z;
  local_c = vmax._0_8_;
  local_4 = vmax.z;
  fVar4 = r.d.x;
  fVar5 = r.d.y;
  auVar3._8_8_ = 0;
  auVar3._0_4_ = r.d.x;
  auVar3._4_4_ = r.d.y;
  auVar3 = divps(_DAT_0010af30,auVar3);
  fVar2 = RVar1.o.x;
  fVar6 = RVar1.o.y;
  fVar7 = (*(float *)((long)&local_18 + (ulong)(fVar4 < 0.0) * 0xc) - fVar2) * auVar3._0_4_;
  fVar8 = (*(float *)((long)&local_18 + (ulong)(0.0 <= fVar5) * 0xc + 4) - fVar6) * auVar3._4_4_;
  if (fVar7 <= fVar8) {
    fVar2 = auVar3._0_4_ * (*(float *)((long)&local_18 + (ulong)(0.0 <= fVar4) * 0xc) - fVar2);
    fVar4 = auVar3._4_4_ * (*(float *)((long)&local_18 + (ulong)(fVar5 < 0.0) * 0xc + 4) - fVar6);
    if (fVar4 <= fVar2) {
      if (fVar4 <= fVar7) {
        fVar4 = fVar7;
      }
      if (fVar4 <= ((&local_10)[(ulong)(0.0 <= r.d.z) * 3] - r.o.z) * (1.0 / r.d.z)) {
        if (fVar2 <= fVar8) {
          fVar8 = fVar2;
        }
        if ((1.0 / r.d.z) * ((&local_10)[(ulong)(r.d.z < 0.0) * 3] - r.o.z) <= fVar8) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool intersects_box(Vec3 vmin, Vec3 vmax, Ray r) {
    Vec3 bounds[2] = {vmin, vmax};
    float tmin, tmax, tymin, tymax, tzmin, tzmax;
    bool sign[3];
    sign[0] = r.d.x < 0.0f;
    sign[1] = r.d.y < 0.0f;
    sign[2] = r.d.z < 0.0f;
    Vec3 invdir = {
        1.0f / r.d.x,
        1.0f / r.d.y,
        1.0f / r.d.z
    };
 
    tmin = (bounds[sign[0]].x - r.o.x) * invdir.x; 
    tmax = (bounds[!sign[0]].x - r.o.x) * invdir.x; 
    tymin = (bounds[sign[1]].y - r.o.y) * invdir.y; 
    tymax = (bounds[!sign[1]].y - r.o.y) * invdir.y; 
 
    if ((tmin > tymax) || (tymin > tmax)) 
        return false; 
    if (tymin > tmin) 
        tmin = tymin; 
    if (tymax < tmax) 
        tmax = tymax; 
 
    tzmin = (bounds[sign[2]].z - r.o.z) * invdir.z; 
    tzmax = (bounds[!sign[2]].z - r.o.z) * invdir.z; 
 
    if ((tmin > tzmax) || (tzmin > tmax)) 
        return false; 
 
    return true; 
}